

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# khash_str2int.h
# Opt level: O0

int khash_str2int_set(void *_hash,char *str,int value)

{
  kh_str2int_t *hash;
  int ret;
  khint_t k;
  int value_local;
  char *str_local;
  void *_hash_local;
  
  if (_hash == (void *)0x0) {
    _hash_local._4_4_ = 0xffffffff;
  }
  else {
    ret = value;
    _k = str;
    str_local = (char *)_hash;
    _hash_local._4_4_ = kh_put_str2int((kh_str2int_t *)_hash,str,(int *)((long)&hash + 4));
    *(int *)(*(long *)((long)_hash + 0x20) + (ulong)_hash_local._4_4_ * 4) = ret;
  }
  return _hash_local._4_4_;
}

Assistant:

static inline int khash_str2int_set(void *_hash, const char *str, int value)
{
    khint_t k;
    int ret;
    khash_t(str2int) *hash = (khash_t(str2int)*)_hash;
    if ( !hash ) return -1;
    k = kh_put(str2int, hash, str, &ret);
    kh_val(hash,k) = value;
    return k;
}